

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort_TEST.cpp
# Opt level: O1

void __thiscall
Valid_case_test_Sort_Sort_unit_test_Test::TestBody(Valid_case_test_Sort_Sort_unit_test_Test *this)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  int i;
  int *a;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  int j;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  int local_4c;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  a = (int *)operator_new__(20000);
  lVar4 = 0;
  do {
    a[lVar4] = (int)lVar4;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5000);
  uVar5 = 1;
  uVar11 = 0;
  do {
    uVar8 = uVar11 & 0xffffffff;
    uVar6 = uVar5;
    do {
      uVar2 = uVar6 & 0xffffffff;
      if (a[(int)uVar8] <= a[uVar6]) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 5000);
    iVar1 = a[(int)uVar8];
    a[(int)uVar8] = a[uVar11];
    a[uVar11] = iVar1;
    uVar11 = uVar11 + 1;
    uVar5 = uVar5 + 1;
  } while (uVar11 != 4999);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x19,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_4c < 4999;
    local_4c = local_4c + 1;
  } while (bVar3);
  lVar4 = 0;
  do {
    iVar1 = a[lVar4];
    lVar7 = lVar4;
    if (lVar4 != 0) {
      do {
        if (a[lVar7 + -1] <= iVar1) goto LAB_0010c093;
        a[lVar7] = a[lVar7 + -1];
        bVar3 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar3);
      lVar7 = 0;
    }
LAB_0010c093:
    a[(int)lVar7] = iVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5000);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x22,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar1 = local_4c + 1;
    bVar3 = local_4c < 4999;
    local_4c = iVar1;
  } while (bVar3);
  uVar10 = 0x9c5;
  do {
    Heapify<int>(a,5000,uVar10 - 2,Less<int>);
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  lVar4 = 4999;
  do {
    iVar1 = *a;
    *a = a[lVar4];
    a[lVar4] = iVar1;
    Heapify<int>(a,(int)lVar4,0,Less<int>);
    uVar11 = lVar4 + 1;
    lVar4 = lVar4 + -1;
  } while (2 < uVar11);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x27,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar1 = local_4c + 1;
    bVar3 = local_4c < 4999;
    local_4c = iVar1;
  } while (bVar3);
  QuickSort<int>(a,0,4999,Less<int>);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x2c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar1 = local_4c + 1;
    bVar3 = local_4c < 4999;
    local_4c = iVar1;
  } while (bVar3);
  temp = (int *)operator_new__(20000);
  Merge_Sort<int>(a,0,4999,Less<int>);
  if (temp != (int *)0x0) {
    operator_delete__(temp);
  }
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x31,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_4c < 4999;
    local_4c = local_4c + 1;
  } while (bVar3);
  uVar5 = 1;
  uVar11 = 0;
  do {
    uVar8 = uVar11 & 0xffffffff;
    uVar6 = uVar5;
    do {
      if (a[(int)uVar8] <= a[uVar6]) {
        uVar8 = uVar6 & 0xffffffff;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 5000);
    iVar1 = a[(int)uVar8];
    a[(int)uVar8] = a[uVar11];
    a[uVar11] = iVar1;
    uVar11 = uVar11 + 1;
    uVar5 = uVar5 + 1;
  } while (uVar11 != 4999);
  local_4c = 4999;
  lVar4 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar4));
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x3c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_58.ptr_ + 8))();
        }
        local_58.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_4c = local_4c + -1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 20000);
  lVar4 = 0;
  do {
    iVar1 = a[lVar4];
    lVar7 = lVar4;
    if (lVar4 != 0) {
      do {
        if (iVar1 < a[lVar7 + -1]) goto LAB_0010c3b9;
        a[lVar7] = a[lVar7 + -1];
        bVar3 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar3);
      lVar7 = 0;
    }
LAB_0010c3b9:
    a[(int)lVar7] = iVar1;
    lVar4 = lVar4 + 1;
    if (lVar4 == 5000) {
      local_4c = 4999;
      lVar4 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar4));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x45,pcVar9);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 20000);
      uVar10 = 0x9c5;
      do {
        Heapify<int>(a,5000,uVar10 - 2,Greater<int>);
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
      lVar4 = 4999;
      do {
        iVar1 = *a;
        *a = a[lVar4];
        a[lVar4] = iVar1;
        Heapify<int>(a,(int)lVar4,0,Greater<int>);
        uVar11 = lVar4 + 1;
        lVar4 = lVar4 + -1;
      } while (2 < uVar11);
      local_4c = 4999;
      lVar4 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar4));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x4a,pcVar9);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 20000);
      lVar4 = 0;
      QuickSort<int>(a,0,4999,Greater<int>);
      local_4c = 4999;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar4));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x4f,pcVar9);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 20000);
      temp = (int *)operator_new__(20000);
      Merge_Sort<int>(a,0,4999,Greater<int>);
      if (temp != (int *)0x0) {
        operator_delete__(temp);
      }
      local_4c = 4999;
      lVar4 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar4));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x54,pcVar9);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) &&
               (local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_58.ptr_ + 8))();
            }
            local_58.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 20000);
      operator_delete__(a);
      return;
    }
  } while( true );
}

Assistant:

TEST(Valid_case_test_Sort, Sort_unit_test){

    int n = 5000;
    int *a = new int[n];
    for (int i = 0; i < n; ++i) {
        a[i] = i;
    }

    /*
     * ALL SORT FOLLOW LESS
     */

    SelectionSort(a, n, Less);

    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    HeapSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    QuickSort(a, 0, n - 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    MergeSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    //---------------------------

    /*
     * ALL SORT FOLLOW GREATER
     */

    SelectionSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    HeapSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    QuickSort(a, 0,  n - 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    MergeSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    delete []a;
}